

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::LibraryDeclarationSyntax::getChildPtr(LibraryDeclarationSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffb0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x70),in_stack_ffffffffffffffa8);
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 5:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax LibraryDeclarationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &library;
        case 2: return &name;
        case 3: return &filePaths;
        case 4: return incDirClause;
        case 5: return &semi;
        default: return nullptr;
    }
}